

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O2

void LibGens::Ym2612Private::KEY_ON(channel_t *CH,int nsl)

{
  int iVar1;
  
  if (CH->_SLOT[nsl].Ecurp == 3) {
    CH->_SLOT[nsl].Fcnt = 0;
    iVar1 = CH->_SLOT[nsl].EincA;
    CH->_SLOT[nsl].Ecnt =
         CH->_SLOT[nsl].ChgEnM &
         (&DECAY_TO_ATTACK)[(uint)(&ENV_TAB)[*(short *)((long)&CH->_SLOT[nsl].Ecnt + 2)]];
    CH->_SLOT[nsl].ChgEnM = -1;
    CH->_SLOT[nsl].Einc = iVar1;
    CH->_SLOT[nsl].Ecmp = 0x10000000;
    CH->_SLOT[nsl].Ecurp = 0;
  }
  return;
}

Assistant:

void Ym2612Private::KEY_ON(channel_t *CH, int nsl)
{
	slot_t *SL = &(CH->_SLOT[nsl]);	// on recupère le bon pointeur de slot

	// la touche est-elle relâchée ?
	if (SL->Ecurp == RELEASE) {
		SL->Fcnt = 0;

		// Fix Ecco 2 splash sound
		SL->Ecnt = (DECAY_TO_ATTACK[ENV_TAB[SL->Ecnt >> ENV_LBITS]] + ENV_ATTACK) & SL->ChgEnM;
		SL->ChgEnM = ~0;

		/*
		SL->Ecnt = DECAY_TO_ATTACK[ENV_TAB[SL->Ecnt >> ENV_LBITS]] + ENV_ATTACK;
		SL->Ecnt = 0;
		*/

		SL->Einc = SL->EincA;
		SL->Ecmp = ENV_DECAY;
		SL->Ecurp = ATTACK;
	}
}